

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::BeginFile
          (PythonGenerator *this,string *name_space_name,bool needs_imports,string *code_ptr,
          string *mod,ImportMap *imports)

{
  bool bVar1;
  char *__rhs;
  _Base_ptr p_Var2;
  Parser *pPVar3;
  string local_import;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  import_entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_f0,code_ptr,"# ");
  __rhs = BaseGenerator::FlatBuffersGeneratedWarning();
  std::operator+(&local_110,&local_f0,__rhs);
  std::operator+(&local_d0.first,&local_110,"\n\n");
  std::__cxx11::string::operator=((string *)code_ptr,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::operator+(&local_110,"# namespace: ",name_space_name);
  std::operator+(&local_d0.first,&local_110,"\n\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_110);
  if (needs_imports) {
    std::operator+(&local_110,".",mod);
    std::__cxx11::string::append((char *)code_ptr);
    pPVar3 = (this->super_BaseGenerator).parser_;
    if ((pPVar3->opts).python_gen_numpy == true) {
      std::__cxx11::string::append((char *)code_ptr);
      pPVar3 = (this->super_BaseGenerator).parser_;
    }
    if ((pPVar3->opts).python_typing == true) {
      std::__cxx11::string::append((char *)code_ptr);
      for (p_Var2 = (imports->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(imports->_M_t)._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair(&local_d0,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(p_Var2 + 1));
        bVar1 = std::operator!=(&local_d0.first,&local_110);
        if (bVar1) {
          std::operator+(&local_50,"from ",&local_d0.first);
          std::operator+(&local_90,&local_50," import ");
          std::operator+(&local_70,&local_90,&local_d0.second);
          std::operator+(&local_f0,&local_70,"\n");
          std::__cxx11::string::append((string *)code_ptr);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&local_d0);
      }
      pPVar3 = (this->super_BaseGenerator).parser_;
    }
    if ((pPVar3->opts).python_gen_numpy == true) {
      std::__cxx11::string::append((char *)code_ptr);
    }
    std::__cxx11::string::~string((string *)&local_110);
  }
  return;
}

Assistant:

void BeginFile(const std::string &name_space_name, const bool needs_imports,
                 std::string *code_ptr, const std::string &mod,
                 const ImportMap &imports) const {
    auto &code = *code_ptr;
    code = code + "# " + FlatBuffersGeneratedWarning() + "\n\n";
    code += "# namespace: " + name_space_name + "\n\n";

    if (needs_imports) {
      const std::string local_import = "." + mod;

      code += "import flatbuffers\n";
      if (parser_.opts.python_gen_numpy) {
        code += "from flatbuffers.compat import import_numpy\n";
      }
      if (parser_.opts.python_typing) {
        code += "from typing import Any\n";

        for (auto import_entry : imports) {
          // If we have a file called, say, "MyType.py" and in it we have a
          // class "MyType", we can generate imports -- usually when we
          // have a type that contains arrays of itself -- of the type
          // "from .MyType import MyType", which Python can't resolve. So
          // if we are trying to import ourself, we skip.
          if (import_entry.first != local_import) {
            code += "from " + import_entry.first + " import " +
                    import_entry.second + "\n";
          }
        }
      }
      if (parser_.opts.python_gen_numpy) {
        code += "np = import_numpy()\n\n";
      }
    }
  }